

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void FindActions(lemon *lemp)

{
  uint uVar1;
  uint uVar2;
  e_assoc eVar3;
  config *pcVar4;
  symbol *psVar5;
  rule *prVar6;
  symbol *psVar7;
  action *paVar8;
  action *paVar9;
  ulong uVar10;
  rule **pprVar11;
  ulong uVar12;
  action *paVar13;
  state *psVar14;
  int iVar15;
  e_action eVar16;
  config **ppcVar17;
  long lVar18;
  long lVar19;
  rule **pprVar20;
  
  for (lVar19 = 0; lVar19 < lemp->nstate; lVar19 = lVar19 + 1) {
    psVar14 = lemp->sorted[lVar19];
    ppcVar17 = &psVar14->cfp;
    while (pcVar4 = *ppcVar17, pcVar4 != (config *)0x0) {
      if (pcVar4->rp->nrhs == pcVar4->dot) {
        for (lVar18 = 0; lVar18 < lemp->nterminal; lVar18 = lVar18 + 1) {
          if (pcVar4->fws[lVar18] != '\0') {
            Action_add(&psVar14->ap,REDUCE,lemp->symbols[lVar18],(char *)pcVar4->rp);
          }
        }
      }
      ppcVar17 = &pcVar4->next;
    }
  }
  if ((lemp->start == (char *)0x0) || (psVar7 = Symbol_find(lemp->start), psVar7 == (symbol *)0x0))
  {
    psVar7 = lemp->rule->lhs;
  }
  lVar19 = 0;
  Action_add(&(*lemp->sorted)->ap,ACCEPT,psVar7,(char *)0x0);
  do {
    uVar1 = lemp->nstate;
    if ((int)uVar1 <= lVar19) {
      pprVar20 = &lemp->rule;
      pprVar11 = pprVar20;
      while (prVar6 = *pprVar11, prVar6 != (rule *)0x0) {
        prVar6->canReduce = LEMON_FALSE;
        pprVar11 = &prVar6->next;
      }
      uVar12 = 0;
      uVar10 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar10 = uVar12;
      }
      for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        psVar14 = lemp->sorted[uVar12];
        while (psVar14 = (state *)psVar14->ap, psVar14 != (state *)0x0) {
          if (*(e_action *)&psVar14->cfp == REDUCE) {
            ((anon_union_8_2_743af1f4_for_x *)&psVar14->statenum)->rp->canReduce = LEMON_TRUE;
          }
        }
      }
      while (prVar6 = *pprVar20, prVar6 != (rule *)0x0) {
        if (prVar6->canReduce == LEMON_FALSE) {
          ErrorMsg(lemp->filename,prVar6->ruleline,"This rule can not be reduced.\n");
          lemp->errorcnt = lemp->errorcnt + 1;
        }
        pprVar20 = &prVar6->next;
      }
      return;
    }
    psVar14 = lemp->sorted[lVar19];
    paVar8 = Action_sort(psVar14->ap);
    psVar14->ap = paVar8;
    while ((paVar9 = paVar8, paVar9 != (action *)0x0 &&
           (paVar8 = paVar9->next, paVar13 = paVar8, paVar8 != (action *)0x0))) {
      for (; (paVar13 != (action *)0x0 && (psVar7 = paVar9->sp, paVar13->sp == psVar7));
          paVar13 = paVar13->next) {
        eVar16 = paVar9->type;
        iVar15 = 0;
        if (eVar16 == SHIFT) {
          eVar16 = paVar13->type;
          if (eVar16 == REDUCE) {
            psVar5 = ((paVar13->x).rp)->precsym;
            if (((psVar5 == (symbol *)0x0) || (uVar1 = psVar7->prec, (int)uVar1 < 0)) ||
               (uVar2 = psVar5->prec, (int)uVar2 < 0)) {
LAB_001048de:
              paVar13->type = SRCONFLICT;
              iVar15 = 1;
            }
            else {
              if (uVar2 < uVar1) {
LAB_001048bd:
                paVar13->type = RD_RESOLVED;
              }
              else {
                if ((uVar2 <= uVar1) && (eVar3 = psVar7->assoc, eVar3 != LEFT)) {
                  if (eVar3 == NONE) goto LAB_001048de;
                  if (eVar3 != RIGHT) {
                    __assert_fail("spx->prec==spy->prec && spx->assoc==NONE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                                  ,0x457,
                                  "int resolve_conflict(struct action *, struct action *, struct symbol *)"
                                 );
                  }
                  goto LAB_001048bd;
                }
                paVar9->type = SH_RESOLVED;
              }
              iVar15 = 0;
            }
          }
          else {
            iVar15 = 0;
            if (eVar16 != SHIFT) goto LAB_00104881;
            paVar13->type = SSCONFLICT;
            eVar16 = paVar9->type;
            iVar15 = 1;
            if (eVar16 != SHIFT) goto LAB_001047f6;
          }
        }
        else {
LAB_001047f6:
          if (eVar16 == REDUCE) {
            eVar16 = paVar13->type;
            if (eVar16 == REDUCE) {
              psVar7 = ((paVar9->x).rp)->precsym;
              if (((psVar7 == (symbol *)0x0) ||
                  (psVar5 = ((paVar13->x).rp)->precsym, psVar5 == (symbol *)0x0)) ||
                 ((uVar1 = psVar7->prec, (int)uVar1 < 0 ||
                  ((uVar2 = psVar5->prec, (int)uVar2 < 0 || (uVar1 == uVar2)))))) {
                paVar13->type = RRCONFLICT;
                iVar15 = iVar15 + 1;
              }
              else if (uVar2 < uVar1) {
                paVar13->type = RD_RESOLVED;
              }
              else if (uVar1 < uVar2) {
                paVar9->type = RD_RESOLVED;
              }
            }
            else {
LAB_00104881:
              if (4 < eVar16 - SSCONFLICT) {
                __assert_fail("apx->type==SH_RESOLVED || apx->type==RD_RESOLVED || apx->type==SSCONFLICT || apx->type==SRCONFLICT || apx->type==RRCONFLICT || apy->type==SH_RESOLVED || apy->type==RD_RESOLVED || apy->type==SSCONFLICT || apy->type==SRCONFLICT || apy->type==RRCONFLICT"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                              ,0x473,
                              "int resolve_conflict(struct action *, struct action *, struct symbol *)"
                             );
              }
            }
          }
          else if (4 < eVar16 - SSCONFLICT) {
            eVar16 = paVar13->type;
            goto LAB_00104881;
          }
        }
        lemp->nconflict = lemp->nconflict + iVar15;
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

void FindActions(struct lemon *lemp)
{
  int i,j;
  struct config *cfp;
  struct state *stp;
  struct symbol *sp;
  struct rule *rp;

  /* Add all of the reduce actions 
  ** A reduce action is added for each element of the followset of
  ** a configuration which has its dot at the extreme right.
  */
  for(i=0; i<lemp->nstate; i++){   /* Loop over all states */
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){  /* Loop over all configurations */
      if( cfp->rp->nrhs==cfp->dot ){        /* Is dot at extreme right? */
        for(j=0; j<lemp->nterminal; j++){
          if( SetFind(cfp->fws,j) ){
            /* Add a reduce action to the state "stp" which will reduce by the
            ** rule "cfp->rp" if the lookahead symbol is "lemp->symbols[j]" */
            Action_add(&stp->ap,REDUCE,lemp->symbols[j],(char *)cfp->rp);
          }
	}
      }
    }
  }

  /* Add the accepting token */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ) sp = lemp->rule->lhs;
  }else{
    sp = lemp->rule->lhs;
  }
  /* Add to the first state (which is always the starting state of the
  ** finite state machine) an action to ACCEPT if the lookahead is the
  ** start nonterminal.  */
  Action_add(&lemp->sorted[0]->ap,ACCEPT,sp,0);

  /* Resolve conflicts */
  for(i=0; i<lemp->nstate; i++){
    struct action *ap, *nap;
    struct state *stp;
    stp = lemp->sorted[i];
    /* assert( stp->ap ); */
    stp->ap = Action_sort(stp->ap);
    for(ap=stp->ap; ap && ap->next; ap=ap->next){
      for(nap=ap->next; nap && nap->sp==ap->sp; nap=nap->next){
         /* The two actions "ap" and "nap" have the same lookahead.
         ** Figure out which one should be used */
         lemp->nconflict += resolve_conflict(ap,nap,lemp->errsym);
      }
    }
  }

  /* Report an error for each rule that can never be reduced. */
  for(rp=lemp->rule; rp; rp=rp->next) rp->canReduce = LEMON_FALSE;
  for(i=0; i<lemp->nstate; i++){
    struct action *ap;
    for(ap=lemp->sorted[i]->ap; ap; ap=ap->next){
      if( ap->type==REDUCE ) ap->x.rp->canReduce = LEMON_TRUE;
    }
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    if( rp->canReduce ) continue;
    ErrorMsg(lemp->filename,rp->ruleline,"This rule can not be reduced.\n");
    lemp->errorcnt++;
  }
}